

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O1

FxExpression * __thiscall FxCVar::Resolve(FxCVar *this,FCompileContext *ctx)

{
  int iVar1;
  PInt **ppPVar2;
  
  if ((this->super_FxExpression).isresolved == false) {
    (this->super_FxExpression).isresolved = true;
    iVar1 = (*this->CVar->_vptr_FBaseCVar[2])();
    switch(iVar1) {
    case 0:
    case 5:
      ppPVar2 = (PInt **)&TypeBool;
      break;
    case 1:
    case 6:
      ppPVar2 = &TypeSInt32;
      break;
    case 2:
      ppPVar2 = (PInt **)&TypeFloat64;
      break;
    case 3:
      ppPVar2 = (PInt **)&TypeString;
      break;
    case 4:
      ppPVar2 = (PInt **)&TypeColor;
      break;
    default:
      FScriptPosition::Message
                (&(this->super_FxExpression).ScriptPosition,2,"Unknown CVar type for %s",
                 this->CVar->Name);
      (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
      return (FxExpression *)0x0;
    }
    (this->super_FxExpression).ValueType = (PType *)*ppPVar2;
  }
  return &this->super_FxExpression;
}

Assistant:

FxExpression *FxCVar::Resolve(FCompileContext &ctx)
{
	CHECKRESOLVED();
	switch (CVar->GetRealType())
	{
	case CVAR_Bool:
	case CVAR_DummyBool:
		ValueType = TypeBool;
		break;

	case CVAR_Int:
	case CVAR_DummyInt:
		ValueType = TypeSInt32;
		break;

	case CVAR_Color:
		ValueType = TypeColor;
		break;

	case CVAR_Float:
		ValueType = TypeFloat64;
		break;

	case CVAR_String:
		ValueType = TypeString;
		break;

	default:
		ScriptPosition.Message(MSG_ERROR, "Unknown CVar type for %s", CVar->GetName());
		delete this;
		return nullptr;
	}
	return this;
}